

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish.cpp
# Opt level: O3

int __thiscall ncnn::Swish::forward_inplace(Swish *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    pvVar6 = bottom_top_blob->data;
    lVar7 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar5 = 0;
        do {
          fVar1 = *(float *)((long)pvVar6 + uVar5 * 4);
          fVar9 = expf(-fVar1);
          *(float *)((long)pvVar6 + uVar5 * 4) = fVar1 / (fVar9 + 1.0);
          uVar5 = uVar5 + 1;
        } while (uVar8 != uVar5);
      }
      lVar7 = lVar7 + 1;
      pvVar6 = (void *)((long)pvVar6 + sVar3 * sVar4);
    } while (lVar7 != iVar2);
  }
  return 0;
}

Assistant:

int Swish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            float x = ptr[i];
            ptr[i] = static_cast<float>(x / (1.f + expf(-x)));
        }
    }

    return 0;
}